

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall
RegisterParserTestPhonySelfReferenceIgnored::RegisterParserTestPhonySelfReferenceIgnored
          (RegisterParserTestPhonySelfReferenceIgnored *this)

{
  RegisterTest(ParserTestPhonySelfReferenceIgnored::Create,"ParserTest.PhonySelfReferenceIgnored");
  return;
}

Assistant:

TEST_F(ParserTest, PhonySelfReferenceIgnored) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"build a: phony a\n"
));

  Node* node = state.LookupNode("a");
  Edge* edge = node->in_edge();
  ASSERT_TRUE(edge->inputs_.empty());
}